

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

MidiEvent * __thiscall smf::MidiFile::addEvent(MidiFile *this,MidiEvent *mfevent)

{
  pointer ppMVar1;
  MidiEvent *pMVar2;
  
  if (this->m_theTrackState == 1) {
    MidiEventList::push_back
              (*(this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start,mfevent);
    ppMVar1 = (this->m_events).
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_0011a381:
    pMVar2 = MidiEventList::back(*ppMVar1);
    return pMVar2;
  }
  ppMVar1 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(long)mfevent->track <
      (ulong)((long)(this->m_events).
                    super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3)) {
    MidiEventList::push_back(ppMVar1[mfevent->track],mfevent);
    ppMVar1 = (this->m_events).
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)mfevent->track <
        (ulong)((long)(this->m_events).
                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3)) {
      ppMVar1 = ppMVar1 + mfevent->track;
      goto LAB_0011a381;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

MidiEvent* MidiFile::addEvent(MidiEvent& mfevent) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		m_events[0]->push_back(mfevent);
		return &m_events[0]->back();
	} else {
		m_events.at(mfevent.track)->push_back(mfevent);
		return &m_events.at(mfevent.track)->back();
	}
}